

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkillTree.cpp
# Opt level: O0

void __thiscall SkillTree::drawSelf(SkillTree *this,PixelGameEngine *pge,int64_t *internetPoints)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference __k;
  reference pvVar2;
  anon_union_4_2_12391da5_for_Pixel_0 *local_128;
  value_type *node_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>_>_>
  *__range1_1;
  v2d_generic<float> local_ec;
  vi2d local_e4;
  v2d_generic<float> local_dc;
  v2d_generic<float> local_d4;
  vi2d local_cc;
  anon_union_4_2_12391da5_for_Pixel_0 local_c4;
  Pixel color;
  v2d_generic local_b8 [8];
  undefined4 local_b0;
  undefined1 local_ac [24];
  v2d_generic<float> posTo;
  v2d_generic local_8c [8];
  undefined4 local_84;
  undefined1 local_80 [24];
  v2d_generic<float> posFrom;
  mapped_type *depNode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dependency;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  value_type *node;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>_>_>
  *__range1;
  int64_t *internetPoints_local;
  PixelGameEngine *pge_local;
  SkillTree *this_local;
  
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>_>_>
           ::begin(&this->nodes);
  node = (value_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>_>_>
         ::end(&this->nodes);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_true>
                         *)&node);
    if (!bVar1) break;
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_false,_true>
             ::operator*(&__end1);
    SkillTreeNode::drawSelf(&pvVar2->second,pge);
    this_00 = SkillTreeNode::getDependecies_abi_cxx11_(&pvVar2->second);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    dependency = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&dependency);
      if (!bVar1) break;
      __k = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end2);
      posFrom = (v2d_generic<float>)
                std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>_>_>
                ::at(&this->nodes,__k);
      SkillTreeNode::getPos((SkillTreeNode *)local_80);
      local_84 = 0x41800000;
      olc::v2d_generic<float>::operator*((v2d_generic<float> *)(local_80 + 8),(float *)local_80);
      olc::v2d_generic<int>::v2d_generic((v2d_generic<int> *)&posTo,4,4);
      olc::v2d_generic::operator_cast_to_v2d_generic(local_8c);
      olc::v2d_generic<float>::operator+
                ((v2d_generic<float> *)(local_80 + 0x10),(v2d_generic<float> *)(local_80 + 8));
      SkillTreeNode::getPos((SkillTreeNode *)local_ac);
      local_b0 = 0x41800000;
      olc::v2d_generic<float>::operator*((v2d_generic<float> *)(local_ac + 8),(float *)local_ac);
      olc::v2d_generic<int>::v2d_generic((v2d_generic<int> *)&stack0xffffffffffffff40,4,4);
      olc::v2d_generic::operator_cast_to_v2d_generic(local_b8);
      olc::v2d_generic<float>::operator+
                ((v2d_generic<float> *)(local_ac + 0x10),(v2d_generic<float> *)(local_ac + 8));
      bVar1 = SkillTreeNode::isCompleted((SkillTreeNode *)posFrom);
      if (bVar1) {
        local_128 = (anon_union_4_2_12391da5_for_Pixel_0 *)&olc::GREEN;
      }
      else {
        local_128 = (anon_union_4_2_12391da5_for_Pixel_0 *)&olc::RED;
      }
      local_c4 = *local_128;
      olc::v2d_generic<float>::v2d_generic(&local_dc,80.0,180.0);
      olc::v2d_generic<float>::operator+(&local_d4,(v2d_generic<float> *)(local_80 + 0x10));
      olc::v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&local_cc);
      olc::v2d_generic<float>::v2d_generic((v2d_generic<float> *)((long)&__range1_1 + 4),80.0,180.0)
      ;
      olc::v2d_generic<float>::operator+(&local_ec,(v2d_generic<float> *)(local_ac + 0x10));
      olc::v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&local_e4);
      __range1_1._0_4_ = local_c4.n;
      olc::PixelGameEngine::DrawLine(pge,&local_cc,&local_e4,(Pixel)local_c4.field_1,0xffffffff);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_false,_true>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>_>_>
             ::begin(&this->nodes);
  node_1 = (value_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>_>_>
           ::end(&this->nodes);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1_1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_true>
                         *)&node_1);
    if (!bVar1) break;
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_false,_true>
             ::operator*(&__end1_1);
    SkillTreeNode::drawExplanation(&pvVar2->second,pge,internetPoints);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_false,_true>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void SkillTree::drawSelf(olc::PixelGameEngine *pge, std::int64_t &internetPoints) const {
    for (auto &node : nodes) {
	node.second.drawSelf(pge);
	for (const auto &dependency : node.second.getDependecies()) {
	    const auto &depNode = nodes.at(dependency);
	    const auto posFrom = depNode.getPos() * 16 + olc::vi2d{4, 4};
	    const auto posTo = node.second.getPos() * 16 + olc::vi2d{4, 4};
	    const auto color = depNode.isCompleted() ? olc::GREEN : olc::RED;
	    pge->DrawLine(posFrom + olc::vf2d{80, 180}, posTo + olc::vf2d{80, 180}, color);
	}
    }
    for (auto &node : nodes) {
	node.second.drawExplanation(pge, internetPoints);
    }
}